

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

unsigned_long xmlHashComputeKey(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3)

{
  ulong uStack_30;
  char ch;
  unsigned_long value;
  xmlChar *name3_local;
  xmlChar *name2_local;
  xmlChar *name_local;
  xmlHashTablePtr table_local;
  
  uStack_30 = (ulong)table->random_seed;
  if (name != (xmlChar *)0x0) {
    uStack_30 = (long)(int)((uint)*name * 0x1e) + uStack_30;
    name2_local = name;
    while( true ) {
      if (*name2_local == '\0') break;
      uStack_30 = uStack_30 ^ uStack_30 * 0x20 + (uStack_30 >> 3) + (long)(char)*name2_local;
      name2_local = name2_local + 1;
    }
  }
  uStack_30 = uStack_30 ^ uStack_30 * 0x20 + (uStack_30 >> 3);
  name3_local = name2;
  if (name2 != (xmlChar *)0x0) {
    while( true ) {
      if (*name3_local == '\0') break;
      uStack_30 = uStack_30 ^ uStack_30 * 0x20 + (uStack_30 >> 3) + (long)(char)*name3_local;
      name3_local = name3_local + 1;
    }
  }
  uStack_30 = uStack_30 ^ uStack_30 * 0x20 + (uStack_30 >> 3);
  value = (unsigned_long)name3;
  if (name3 != (xmlChar *)0x0) {
    while( true ) {
      if (*(char *)value == '\0') break;
      uStack_30 = uStack_30 ^ uStack_30 * 0x20 + (uStack_30 >> 3) + (long)*(char *)value;
      value = value + 1;
    }
  }
  return uStack_30 % (ulong)(long)table->size;
}

Assistant:

static unsigned long
xmlHashComputeKey(xmlHashTablePtr table, const xmlChar *name,
	          const xmlChar *name2, const xmlChar *name3) {
    unsigned long value = 0L;
    char ch;

#ifdef HASH_RANDOMIZATION
    value = table->random_seed;
#endif
    if (name != NULL) {
	value += 30 * (*name);
	while ((ch = *name++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    value = value ^ ((value << 5) + (value >> 3));
    if (name2 != NULL) {
	while ((ch = *name2++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    value = value ^ ((value << 5) + (value >> 3));
    if (name3 != NULL) {
	while ((ch = *name3++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    return (value % table->size);
}